

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.h
# Opt level: O2

void cppqc::detail::outputLabels
               (ostream *out,size_t numSuccess,
               multimap<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *labels)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  long lVar5;
  
  p_Var4 = &(labels->_M_t)._M_impl.super__Rb_tree_header._M_header;
  lVar5 = -0x14;
  while( true ) {
    if (p_Var4 == (labels->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
      return;
    }
    if (lVar5 == 0) break;
    lVar2 = std::_Rb_tree_decrement(p_Var4);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (lVar2 + 0x28),"");
    if (bVar1) {
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 3;
      std::_Rb_tree_decrement(p_Var4);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      poVar3 = std::operator<<(poVar3,"% ");
      lVar2 = std::_Rb_tree_decrement(p_Var4);
      poVar3 = std::operator<<(poVar3,(string *)(lVar2 + 0x28));
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var4);
    lVar5 = lVar5 + 1;
  }
  poVar3 = std::operator<<(out,"  ...");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

inline void outputLabels(
    std::ostream& out,
    std::size_t numSuccess,
    const std::multimap<std::size_t, std::string>& labels) {
  std::size_t cnt = 20;
  for (auto it = labels.rbegin(); it != labels.rend(); --cnt, ++it) {
    if (cnt == 0) {
      out << "  ..." << std::endl;
      break;
    }

    if (it->second != "") {
      out << std::setw(3) << (100 * it->first / numSuccess) << "% "
          << it->second << std::endl;
    }
  }
}